

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *this;
  ComplexTypeInfo *valueToAdopt;
  XSerializeEngine *__nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  ulong uVar3;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  __nbytes = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&local_38);
    if (*objToLoad == (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)0x0
       ) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this->fMemoryManager = pMVar2;
      this->fAdoptedElems = toAdopt;
      this->fBucketList = (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> **)0x0;
      this->fHashModulus = local_38;
      this->fInitialModulus = local_38;
      this->fCount = 0;
      RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::initialize
                (this,local_38);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_40 = 0;
    XSerializeEngine::readSize(serEng,&local_40);
    if (local_40 != 0) {
      uVar3 = 0;
      __buf = extraout_RDX;
      do {
        valueToAdopt = (ComplexTypeInfo *)
                       XSerializeEngine::read(serEng,0x445b08,__buf,(size_t)__nbytes);
        RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::put
                  (*objToLoad,valueToAdopt->fTypeName,valueToAdopt);
        uVar3 = uVar3 + 1;
        __buf = extraout_RDX_00;
      } while (uVar3 < local_40);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<ComplexTypeInfo>** objToLoad
                                   , int
                                   , bool                              toAdopt
                                   , XSerializeEngine&                 serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<ComplexTypeInfo>(
                                                             hashModulus
                                                           , toAdopt
                                                           , serEng.getMemoryManager()
                                                           );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            ComplexTypeInfo*  data;
            serEng>>data;

           (*objToLoad)->put((void*)data->getTypeName(), data);
        }
    }
}